

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::drawutil::makePipelineLayoutWithoutDescriptors
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device)

{
  undefined1 local_50 [8];
  VkPipelineLayoutCreateInfo info;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  info.pPushConstantRanges = (VkPushConstantRange *)device;
  memset(local_50,0,0x30);
  local_50._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,vk,(VkDevice)info.pPushConstantRanges,
             (VkPipelineLayoutCreateInfo *)local_50,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> makePipelineLayoutWithoutDescriptors (const DeviceInterface&		vk,
															 const VkDevice				device)
{
	const VkPipelineLayoutCreateInfo info =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(VkPipelineLayoutCreateFlags)0,						// VkPipelineLayoutCreateFlags	flags;
		0u,													// deUint32						setLayoutCount;
		DE_NULL,											// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	return createPipelineLayout(vk, device, &info);
}